

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O3

void pdqsort_detail::
     pdqsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__1,false>
               (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                begin,__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                      end,anon_class_8_1_8991fb9c comp,int bad_allowed,bool leftmost)

{
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  b;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  pointer piVar6;
  pointer piVar7;
  anon_class_8_1_8991fb9c comp_00;
  int iVar8;
  bool bVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  _Var15;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  _Var16;
  int *piVar17;
  pair<int,_int> *ppVar18;
  ulong uVar19;
  int iVar20;
  long lVar21;
  HighsInt minLen1;
  long lVar22;
  uint uVar23;
  pair<int,_int> *ppVar24;
  int __tmp;
  ulong uVar25;
  pair<int,_int> pVar26;
  pair<int,_int> *ppVar27;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  a;
  pair<int,_int> *ppVar28;
  HighsInt minLen1_1;
  int iVar29;
  long lVar30;
  ulong uVar31;
  int iVar32;
  _DistanceType __len;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_presolve_HPresolve_cpp:4999:7)>
  __cmp;
  int local_b0;
  int local_a8;
  int local_a0;
  int local_88;
  int local_54;
  
  lVar11 = (long)end._M_current - (long)begin._M_current;
  uVar14 = lVar11 >> 3;
  if (0x17 < (long)uVar14) {
    b._M_current = end._M_current + -1;
    a._M_current = begin._M_current;
    local_54 = bad_allowed;
LAB_0031cce7:
    uVar12 = uVar14 >> 1;
    _Var15._M_current = a._M_current + uVar12;
    _Var16._M_current =
         (pair<int,_int> *)
         ((comp.this)->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start;
    comp_00.this = (HPresolve *)
                   ((comp.this)->colsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
    if (uVar14 < 0x81) {
      sort3<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__1>
                ((pdqsort_detail *)_Var15._M_current,a,b,_Var16,comp_00);
    }
    else {
      sort3<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__1>
                ((pdqsort_detail *)a._M_current,_Var15,b,_Var16,comp_00);
      sort3<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__1>
                ((pdqsort_detail *)(a._M_current + 1),a._M_current + (uVar12 - 1),
                 end._M_current + -2,
                 (pair<int,_int> *)
                 ((comp.this)->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (HPresolve *)
                 ((comp.this)->colsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start);
      _Var16._M_current = a._M_current + uVar12 + 1;
      sort3<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__1>
                ((pdqsort_detail *)(a._M_current + 2),_Var16,end._M_current + -3,
                 (pair<int,_int> *)
                 ((comp.this)->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (HPresolve *)
                 ((comp.this)->colsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start);
      sort3<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__1>
                ((pdqsort_detail *)(a._M_current + (uVar12 - 1)),_Var15,_Var16,
                 (pair<int,_int> *)
                 ((comp.this)->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (HPresolve *)
                 ((comp.this)->colsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start);
      pVar26 = *a._M_current;
      *a._M_current = _Var16._M_current[-1];
      _Var16._M_current[-1] = pVar26;
    }
    piVar6 = ((comp.this)->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar7 = ((comp.this)->colsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((leftmost & 1U) == 0) {
      uVar23 = a._M_current[-1].first;
      uVar1 = a._M_current[-1].second;
      uVar2 = (a._M_current)->first;
      iVar32 = piVar7[(int)uVar1];
      iVar29 = piVar6[(int)uVar23];
      iVar4 = iVar29;
      if (iVar32 < iVar29) {
        iVar4 = iVar32;
      }
      uVar3 = (a._M_current)->second;
      iVar13 = piVar7[(int)uVar3];
      iVar20 = piVar6[(int)uVar2];
      iVar5 = iVar20;
      if (iVar13 < iVar20) {
        iVar5 = iVar13;
      }
      if ((iVar4 != 2) || (iVar5 == 2)) {
        if ((iVar4 == 2) || (iVar5 != 2)) {
          lVar22 = (long)iVar29 * (long)iVar32;
          lVar10 = (long)iVar20 * (long)iVar13;
          if (lVar22 < lVar10) goto LAB_0031ce28;
          if (lVar22 - lVar10 == 0 || lVar22 < lVar10) {
            if (iVar4 < iVar5) goto LAB_0031ce28;
            if (iVar4 <= iVar5) {
              uVar25 = ((ulong)uVar1 + 0x80c8963be3e4c2f3) * ((ulong)uVar23 + 0xc8497d2a400d9551) >>
                       0x20 ^ ((ulong)uVar1 + 0x8a183895eeac1536) *
                              ((ulong)uVar23 + 0x42d8680e260ae5b);
              uVar12 = ((ulong)uVar3 + 0x80c8963be3e4c2f3) * ((ulong)uVar2 + 0xc8497d2a400d9551) >>
                       0x20 ^ ((ulong)uVar3 + 0x8a183895eeac1536) *
                              ((ulong)uVar2 + 0x42d8680e260ae5b);
              if ((uVar25 < uVar12) ||
                 ((uVar25 <= uVar12 &&
                  (((int)uVar23 < (int)uVar2 ||
                   ((int)uVar23 <= (int)uVar2 && (int)uVar1 < (int)uVar3)))))) goto LAB_0031ce28;
            }
          }
        }
        pVar26 = *a._M_current;
        iVar13 = pVar26.first;
        lVar11 = (long)pVar26 >> 0x20;
        iVar32 = piVar7[lVar11];
        iVar29 = piVar6[iVar13];
        iVar4 = iVar29;
        if (iVar32 < iVar29) {
          iVar4 = iVar32;
        }
        lVar10 = (long)iVar29 * (long)iVar32;
        uVar14 = (((ulong)pVar26 >> 0x20) + 0x80c8963be3e4c2f3) *
                 (((ulong)pVar26 & 0xffffffff) + 0xc8497d2a400d9551) >> 0x20 ^
                 (((ulong)pVar26 >> 0x20) + 0x8a183895eeac1536) *
                 (((ulong)pVar26 & 0xffffffff) + 0x42d8680e260ae5b);
        lVar22 = 0;
        do {
          uVar23 = *(uint *)((long)&(b._M_current)->first + lVar22);
          lVar21 = (long)(int)uVar23;
          uVar1 = *(uint *)((long)end._M_current + lVar22 + -4);
          iVar32 = piVar7[(int)uVar1];
          iVar29 = piVar6[lVar21];
          iVar20 = iVar29;
          if (iVar32 < iVar29) {
            iVar20 = iVar32;
          }
          if ((iVar4 != 2) || (iVar20 == 2)) {
            local_a0 = pVar26.second;
            if ((iVar4 != 2) && (iVar20 == 2)) goto LAB_0031d1f4;
            lVar30 = (long)iVar29 * (long)iVar32;
            if ((lVar30 <= lVar10) &&
               ((lVar10 - lVar30 != 0 && lVar30 <= lVar10 ||
                ((iVar20 <= iVar4 &&
                 ((iVar20 < iVar4 ||
                  ((uVar12 = ((ulong)uVar1 + 0x80c8963be3e4c2f3) *
                             ((ulong)uVar23 + 0xc8497d2a400d9551) >> 0x20 ^
                             ((ulong)uVar1 + 0x8a183895eeac1536) *
                             ((ulong)uVar23 + 0x42d8680e260ae5b), uVar12 <= uVar14 &&
                   ((uVar12 < uVar14 ||
                    (((int)uVar23 <= iVar13 && (((int)uVar23 < iVar13 || ((int)uVar1 <= local_a0))))
                    )))))))))))) goto LAB_0031d1f4;
          }
          lVar22 = lVar22 + -8;
        } while( true );
      }
    }
LAB_0031ce28:
    pVar26 = *a._M_current;
    iVar13 = pVar26.first;
    iVar32 = piVar7[(long)pVar26 >> 0x20];
    iVar29 = piVar6[iVar13];
    iVar4 = iVar29;
    if (iVar32 < iVar29) {
      iVar4 = iVar32;
    }
    lVar22 = (long)iVar29 * (long)iVar32;
    uVar12 = (((ulong)pVar26 >> 0x20) + 0x80c8963be3e4c2f3) *
             (((ulong)pVar26 & 0xffffffff) + 0xc8497d2a400d9551) >> 0x20 ^
             (((ulong)pVar26 >> 0x20) + 0x8a183895eeac1536) *
             (((ulong)pVar26 & 0xffffffff) + 0x42d8680e260ae5b);
    lVar10 = 8;
    do {
      uVar23 = *(uint *)((long)&(a._M_current)->first + lVar10);
      lVar21 = (long)(int)uVar23;
      uVar1 = *(uint *)((long)&(a._M_current)->second + lVar10);
      iVar32 = piVar7[(int)uVar1];
      iVar29 = piVar6[lVar21];
      iVar20 = iVar29;
      if (iVar32 < iVar29) {
        iVar20 = iVar32;
      }
      if ((iVar20 != 2) || (iVar4 == 2)) {
        local_a8 = pVar26.second;
        if ((iVar4 == 2) && (iVar20 != 2)) goto LAB_0031cf4c;
        lVar30 = (long)iVar29 * (long)iVar32;
        if ((lVar22 <= lVar30) &&
           ((lVar30 - lVar22 != 0 && lVar22 <= lVar30 ||
            ((iVar4 <= iVar20 &&
             ((iVar4 < iVar20 ||
              ((uVar25 = ((ulong)uVar1 + 0x80c8963be3e4c2f3) * ((ulong)uVar23 + 0xc8497d2a400d9551)
                         >> 0x20 ^ ((ulong)uVar1 + 0x8a183895eeac1536) *
                                   ((ulong)uVar23 + 0x42d8680e260ae5b), uVar12 <= uVar25 &&
               ((uVar12 < uVar25 ||
                ((iVar13 <= (int)uVar23 && ((iVar13 < (int)uVar23 || (local_a8 <= (int)uVar1))))))))
              )))))))) goto LAB_0031cf4c;
      }
      lVar10 = lVar10 + 8;
    } while( true );
  }
  if (!leftmost) goto LAB_0031dc9a;
LAB_0031c992:
  if ((begin._M_current != end._M_current) && (begin._M_current + 1 != end._M_current)) {
    piVar6 = ((comp.this)->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar7 = ((comp.this)->colsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar11 = 0;
    ppVar24 = begin._M_current + 1;
    ppVar18 = begin._M_current;
    do {
      ppVar27 = ppVar24;
      uVar23 = ppVar18[1].first;
      uVar1 = ppVar18[1].second;
      uVar2 = ppVar18->first;
      iVar32 = piVar7[(int)uVar1];
      iVar29 = piVar6[(int)uVar23];
      iVar4 = iVar29;
      if (iVar32 < iVar29) {
        iVar4 = iVar32;
      }
      uVar3 = ppVar18->second;
      iVar13 = piVar7[(int)uVar3];
      iVar20 = piVar6[(int)uVar2];
      iVar5 = iVar20;
      if (iVar13 < iVar20) {
        iVar5 = iVar13;
      }
      if ((iVar4 == 2) && (iVar5 != 2)) {
LAB_0031ca1a:
        pVar26 = ppVar18[1];
        ppVar18[1].first = uVar2;
        ppVar27->second = ppVar18->second;
        iVar32 = pVar26.first;
        local_b0 = pVar26.second;
        ppVar24 = ppVar27;
        ppVar18 = begin._M_current;
        if (ppVar27 + -1 != begin._M_current) {
          uVar14 = (((ulong)pVar26 >> 0x20) + 0x80c8963be3e4c2f3) *
                   (((ulong)pVar26 & 0xffffffff) + 0xc8497d2a400d9551) >> 0x20 ^
                   (((ulong)pVar26 >> 0x20) + 0x8a183895eeac1536) *
                   (((ulong)pVar26 & 0xffffffff) + 0x42d8680e260ae5b);
          lVar22 = lVar11;
          ppVar28 = ppVar27 + -1;
          do {
            uVar23 = ppVar28[-1].first;
            iVar29 = piVar7[(long)pVar26 >> 0x20];
            iVar4 = piVar6[iVar32];
            iVar13 = iVar4;
            if (iVar29 < iVar4) {
              iVar13 = iVar29;
            }
            uVar1 = ppVar28[-1].second;
            iVar20 = piVar7[(int)uVar1];
            iVar5 = piVar6[(int)uVar23];
            iVar8 = iVar5;
            if (iVar20 < iVar5) {
              iVar8 = iVar20;
            }
            if ((iVar13 != 2) || (iVar8 == 2)) {
              ppVar18 = ppVar28;
              if ((iVar13 != 2) && (iVar8 == 2)) break;
              lVar10 = (long)iVar4 * (long)iVar29;
              lVar21 = (long)iVar5 * (long)iVar20;
              if (lVar21 <= lVar10) {
                if (lVar10 - lVar21 != 0 && lVar21 <= lVar10) break;
                if (iVar8 <= iVar13) {
                  if (iVar8 < iVar13) break;
                  uVar12 = ((ulong)uVar1 + 0x80c8963be3e4c2f3) *
                           ((ulong)uVar23 + 0xc8497d2a400d9551) >> 0x20 ^
                           ((ulong)uVar1 + 0x8a183895eeac1536) * ((ulong)uVar23 + 0x42d8680e260ae5b)
                  ;
                  if (uVar12 <= uVar14) {
                    if (uVar12 < uVar14) {
                      ppVar24 = ppVar28 + 1;
                      break;
                    }
                    if (((int)uVar23 <= iVar32) &&
                       (((int)uVar23 < iVar32 || ((int)uVar1 <= local_b0)))) break;
                  }
                }
              }
            }
            ppVar28->first = uVar23;
            ppVar28->second = uVar1;
            lVar22 = lVar22 + 8;
            ppVar24 = ppVar28;
            ppVar28 = ppVar28 + -1;
            ppVar18 = begin._M_current;
          } while (lVar22 != 0);
        }
        ppVar18->first = iVar32;
        ppVar24[-1].second = local_b0;
      }
      else if ((iVar4 == 2) || (iVar5 != 2)) {
        lVar22 = (long)iVar29 * (long)iVar32;
        lVar10 = (long)iVar20 * (long)iVar13;
        if (lVar22 < lVar10) goto LAB_0031ca1a;
        if (lVar22 - lVar10 == 0 || lVar22 < lVar10) {
          if (iVar4 < iVar5) goto LAB_0031ca1a;
          if (iVar4 <= iVar5) {
            uVar12 = ((ulong)uVar1 + 0x80c8963be3e4c2f3) * ((ulong)uVar23 + 0xc8497d2a400d9551) >>
                     0x20 ^ ((ulong)uVar1 + 0x8a183895eeac1536) *
                            ((ulong)uVar23 + 0x42d8680e260ae5b);
            uVar14 = ((ulong)uVar3 + 0x80c8963be3e4c2f3) * ((ulong)uVar2 + 0xc8497d2a400d9551) >>
                     0x20 ^ ((ulong)uVar3 + 0x8a183895eeac1536) * ((ulong)uVar2 + 0x42d8680e260ae5b)
            ;
            if ((uVar12 < uVar14) ||
               ((uVar12 <= uVar14 &&
                (((int)uVar23 < (int)uVar2 || ((int)uVar1 < (int)uVar3 && (int)uVar23 <= (int)uVar2)
                 ))))) goto LAB_0031ca1a;
          }
        }
      }
      lVar11 = lVar11 + -8;
      ppVar24 = ppVar27 + 1;
      ppVar18 = ppVar27;
    } while (ppVar27 + 1 != end._M_current);
  }
  return;
LAB_0031d1f4:
  ppVar24 = (pair<int,_int> *)((long)&(b._M_current)->first + lVar22);
  if (lVar22 == 0) {
    _Var16._M_current = a._M_current;
    if (a._M_current < ppVar24) {
      ppVar18 = a._M_current + 1;
      pVar26 = (pair<int,_int>)(long)a._M_current[1].first;
      uVar12 = (ulong)a._M_current[1].second;
      iVar32 = piVar7[uVar12];
      iVar29 = piVar6[(long)pVar26];
      iVar20 = iVar29;
      if (iVar32 < iVar29) {
        iVar20 = iVar32;
      }
      if ((iVar4 != 2) || (_Var16._M_current = ppVar18, iVar20 == 2)) {
        piVar17 = &a._M_current[2].second;
        do {
          ppVar27 = (pair<int,_int> *)(piVar17 + -3);
          if ((iVar4 == 2) || (iVar20 != 2)) {
            lVar22 = (long)iVar32 * (long)iVar29;
            _Var16._M_current = ppVar18;
            if (lVar10 < lVar22) goto LAB_0031d424;
            if (lVar10 - lVar22 != 0 && lVar22 <= lVar10) goto LAB_0031d705;
            if (iVar4 < iVar20) goto LAB_0031d424;
            if (iVar20 < iVar4) goto LAB_0031d705;
            uVar25 = ((uVar12 & 0xffffffff) + 0x80c8963be3e4c2f3) *
                     (((ulong)pVar26 & 0xffffffff) + 0xc8497d2a400d9551) >> 0x20 ^
                     ((uVar12 & 0xffffffff) + 0x8a183895eeac1536) *
                     (((ulong)pVar26 & 0xffffffff) + 0x42d8680e260ae5b);
            if (uVar14 < uVar25) goto LAB_0031d424;
            if (uVar25 < uVar14) goto LAB_0031d705;
            if (iVar13 < pVar26.first) goto LAB_0031d424;
            if ((ppVar24 <= ppVar27) || (iVar13 <= pVar26.first && local_a0 < (int)uVar12))
            goto LAB_0031d424;
          }
          else {
LAB_0031d705:
            _Var16._M_current = ppVar27;
            if (ppVar24 <= ppVar27) goto LAB_0031d424;
          }
          ppVar18 = ppVar18 + 1;
          pVar26 = (pair<int,_int>)(long)((pair<int,_int> *)(piVar17 + -1))->first;
          uVar12 = (ulong)*piVar17;
          iVar32 = piVar7[uVar12];
          iVar29 = piVar6[(long)pVar26];
          iVar20 = iVar29;
          if (iVar32 < iVar29) {
            iVar20 = iVar32;
          }
          piVar17 = piVar17 + 2;
        } while ((iVar4 != 2) || (iVar20 == 2));
        goto LAB_0031d30d;
      }
    }
  }
  else {
    _Var16._M_current = a._M_current + 1;
    pVar26 = (pair<int,_int>)(long)a._M_current[1].first;
    uVar12 = (ulong)a._M_current[1].second;
    iVar32 = piVar7[uVar12];
    iVar29 = piVar6[(long)pVar26];
    iVar20 = iVar29;
    if (iVar32 < iVar29) {
      iVar20 = iVar32;
    }
    if ((iVar4 != 2) || (iVar20 == 2)) {
      piVar17 = &a._M_current[2].second;
      do {
        if ((iVar4 == 2) || (iVar20 != 2)) {
          if (lVar10 < (long)iVar32 * (long)iVar29) goto LAB_0031d424;
          if (lVar10 <= (long)iVar32 * (long)iVar29) {
            if (iVar4 < iVar20) goto LAB_0031d424;
            if (iVar4 <= iVar20) {
              uVar25 = ((uVar12 & 0xffffffff) + 0x80c8963be3e4c2f3) *
                       (((ulong)pVar26 & 0xffffffff) + 0xc8497d2a400d9551) >> 0x20 ^
                       (((ulong)pVar26 & 0xffffffff) + 0x42d8680e260ae5b) *
                       ((uVar12 & 0xffffffff) + 0x8a183895eeac1536);
              if (uVar14 < uVar25) goto LAB_0031d424;
              if (uVar14 <= uVar25) {
                if (iVar13 < pVar26.first) goto LAB_0031d424;
                if ((local_a0 < (int)uVar12) && (iVar13 <= pVar26.first)) break;
              }
            }
          }
        }
        _Var16._M_current = _Var16._M_current + 1;
        pVar26 = (pair<int,_int>)(long)((pair<int,_int> *)(piVar17 + -1))->first;
        uVar12 = (ulong)*piVar17;
        iVar32 = piVar7[uVar12];
        iVar29 = piVar6[(long)pVar26];
        iVar20 = iVar29;
        if (iVar32 < iVar29) {
          iVar20 = iVar32;
        }
        piVar17 = piVar17 + 2;
      } while ((iVar4 != 2) || (iVar20 == 2));
LAB_0031d30d:
      _Var16._M_current = (pair<int,_int> *)(piVar17 + -3);
    }
  }
LAB_0031d424:
  if (_Var16._M_current < ppVar24) {
    do {
      (_Var16._M_current)->first = (int)lVar21;
      ppVar24->first = pVar26.first;
      iVar32 = (_Var16._M_current)->second;
      (_Var16._M_current)->second = ppVar24->second;
      ppVar24->second = iVar32;
      iVar32 = piVar7[lVar11];
      iVar29 = piVar6[iVar13];
      iVar4 = iVar29;
      if (iVar32 < iVar29) {
        iVar4 = iVar32;
      }
      lVar22 = (long)iVar29 * (long)iVar32;
      ppVar18 = ppVar24;
      do {
        do {
          ppVar24 = ppVar18 + -1;
          uVar23 = ppVar24->first;
          lVar21 = (long)(int)uVar23;
          uVar1 = ppVar18[-1].second;
          iVar32 = piVar7[(int)uVar1];
          iVar29 = piVar6[lVar21];
          iVar20 = iVar29;
          if (iVar32 < iVar29) {
            iVar20 = iVar32;
          }
          ppVar18 = ppVar24;
        } while ((iVar4 == 2) && (iVar20 != 2));
        if ((iVar4 != 2) && (iVar20 == 2)) break;
        lVar10 = (long)iVar29 * (long)iVar32;
      } while ((lVar22 < lVar10) ||
              ((lVar22 - lVar10 == 0 || lVar22 < lVar10 &&
               ((iVar4 < iVar20 ||
                ((iVar4 <= iVar20 &&
                 ((uVar12 = ((ulong)uVar1 + 0x80c8963be3e4c2f3) *
                            ((ulong)uVar23 + 0xc8497d2a400d9551) >> 0x20 ^
                            ((ulong)uVar1 + 0x8a183895eeac1536) *
                            ((ulong)uVar23 + 0x42d8680e260ae5b), uVar14 < uVar12 ||
                  ((uVar14 <= uVar12 &&
                   ((iVar13 < (int)uVar23 || ((iVar13 <= (int)uVar23 && (local_a0 < (int)uVar1))))))
                  ))))))))));
      ppVar18 = _Var16._M_current + 1;
      pVar26 = (pair<int,_int>)(long)_Var16._M_current[1].first;
      uVar12 = (ulong)_Var16._M_current[1].second;
      iVar32 = piVar7[uVar12];
      iVar29 = piVar6[(long)pVar26];
      iVar20 = iVar29;
      if (iVar32 < iVar29) {
        iVar20 = iVar32;
      }
      if ((iVar4 != 2) || (iVar20 == 2)) {
        piVar17 = &_Var16._M_current[2].second;
        do {
          if ((iVar4 == 2) || (iVar20 != 2)) {
            lVar10 = (long)iVar32 * (long)iVar29;
            if (lVar22 < lVar10) goto LAB_0031d60f;
            if (lVar22 - lVar10 == 0 || lVar22 < lVar10) {
              if (iVar4 < iVar20) goto LAB_0031d60f;
              if (iVar4 <= iVar20) {
                uVar25 = ((uVar12 & 0xffffffff) + 0x80c8963be3e4c2f3) *
                         (((ulong)pVar26 & 0xffffffff) + 0xc8497d2a400d9551) >> 0x20 ^
                         (((ulong)pVar26 & 0xffffffff) + 0x42d8680e260ae5b) *
                         ((uVar12 & 0xffffffff) + 0x8a183895eeac1536);
                if (uVar14 < uVar25) goto LAB_0031d60f;
                if (uVar14 <= uVar25) {
                  if (iVar13 < pVar26.first) break;
                  if ((local_a0 < (int)uVar12) && (iVar13 <= pVar26.first)) goto LAB_0031d60f;
                }
              }
            }
          }
          ppVar18 = ppVar18 + 1;
          pVar26 = (pair<int,_int>)(long)((pair<int,_int> *)(piVar17 + -1))->first;
          uVar12 = (ulong)*piVar17;
          iVar32 = piVar7[uVar12];
          iVar29 = piVar6[(long)pVar26];
          iVar20 = iVar29;
          if (iVar32 < iVar29) {
            iVar20 = iVar32;
          }
          piVar17 = piVar17 + 2;
        } while ((iVar4 != 2) || (iVar20 == 2));
        ppVar18 = (pair<int,_int> *)(piVar17 + -3);
      }
LAB_0031d60f:
      _Var16._M_current = ppVar18;
    } while (_Var16._M_current < ppVar24);
  }
  (a._M_current)->first = uVar23;
  (a._M_current)->second = ppVar24->second;
  ppVar24->first = iVar13;
  ppVar24->second = local_a0;
  begin._M_current = ppVar24 + 1;
  lVar11 = (long)end._M_current - (long)begin._M_current;
  uVar14 = lVar11 >> 3;
LAB_0031dc5d:
  a._M_current = begin._M_current;
  if ((long)uVar14 < 0x18) goto LAB_0031dc8f;
  goto LAB_0031cce7;
LAB_0031cf4c:
  ppVar24 = (pair<int,_int> *)((long)&(a._M_current)->first + lVar10);
  _Var16._M_current = b._M_current;
  if (lVar10 == 8) {
    _Var16._M_current = end._M_current;
    if (ppVar24 < end._M_current) {
      uVar25 = (ulong)end._M_current[-1].first;
      uVar31 = (ulong)end._M_current[-1].second;
      iVar32 = piVar7[uVar31];
      iVar29 = piVar6[uVar25];
      _Var16._M_current = b._M_current;
      iVar20 = iVar29;
      if (iVar32 < iVar29) {
        iVar20 = iVar32;
      }
      while ((iVar20 != 2 || (iVar4 == 2))) {
        if ((iVar4 == 2) && (iVar20 != 2)) {
LAB_0031d053:
          if (_Var16._M_current <= ppVar24) break;
        }
        else {
          lVar10 = (long)iVar32 * (long)iVar29;
          if (lVar10 < lVar22) break;
          if (lVar10 - lVar22 != 0 && lVar22 <= lVar10) goto LAB_0031d053;
          if (iVar20 < iVar4) break;
          if (iVar4 < iVar20) goto LAB_0031d053;
          uVar19 = ((uVar31 & 0xffffffff) + 0x80c8963be3e4c2f3) *
                   ((uVar25 & 0xffffffff) + 0xc8497d2a400d9551) >> 0x20 ^
                   ((uVar31 & 0xffffffff) + 0x8a183895eeac1536) *
                   ((uVar25 & 0xffffffff) + 0x42d8680e260ae5b);
          if (uVar19 < uVar12) break;
          if (uVar12 < uVar19) goto LAB_0031d053;
          if ((int)uVar25 < iVar13) break;
          if ((_Var16._M_current <= ppVar24) || ((int)uVar25 <= iVar13 && (int)uVar31 < local_a8))
          break;
        }
        ppVar18 = _Var16._M_current + -1;
        uVar25 = (ulong)_Var16._M_current[-1].first;
        uVar31 = (ulong)_Var16._M_current[-1].second;
        iVar32 = piVar7[uVar31];
        iVar29 = piVar6[uVar25];
        _Var16._M_current = ppVar18;
        iVar20 = iVar29;
        if (iVar32 < iVar29) {
          iVar20 = iVar32;
        }
      }
    }
  }
  else {
    uVar25 = (ulong)end._M_current[-1].first;
    uVar31 = (ulong)end._M_current[-1].second;
    iVar32 = piVar7[uVar31];
    iVar29 = piVar6[uVar25];
    iVar20 = iVar29;
    if (iVar32 < iVar29) {
      iVar20 = iVar32;
    }
    while ((iVar20 != 2 || (iVar4 == 2))) {
      if ((iVar4 != 2) || (iVar20 == 2)) {
        lVar10 = (long)iVar32 * (long)iVar29;
        if (lVar10 < lVar22) break;
        if (lVar10 - lVar22 == 0 || lVar10 < lVar22) {
          if (iVar20 < iVar4) break;
          if (iVar20 <= iVar4) {
            uVar19 = ((uVar31 & 0xffffffff) + 0x80c8963be3e4c2f3) *
                     ((uVar25 & 0xffffffff) + 0xc8497d2a400d9551) >> 0x20 ^
                     ((uVar25 & 0xffffffff) + 0x42d8680e260ae5b) *
                     ((uVar31 & 0xffffffff) + 0x8a183895eeac1536);
            if ((uVar19 < uVar12) ||
               ((uVar19 <= uVar12 &&
                (((int)uVar25 < iVar13 || (((int)uVar31 < local_a8 && ((int)uVar25 <= iVar13))))))))
            break;
          }
        }
      }
      ppVar18 = _Var16._M_current + -1;
      uVar25 = (ulong)_Var16._M_current[-1].first;
      uVar31 = (ulong)_Var16._M_current[-1].second;
      iVar32 = piVar7[uVar31];
      iVar29 = piVar6[uVar25];
      _Var16._M_current = ppVar18;
      iVar20 = iVar29;
      if (iVar32 < iVar29) {
        iVar20 = iVar32;
      }
    }
  }
  begin._M_current = ppVar24;
  if (ppVar24 < _Var16._M_current) {
    uVar25 = (ulong)(uint)(_Var16._M_current)->first;
    ppVar18 = _Var16._M_current;
LAB_0031d88c:
    (begin._M_current)->first = (int)uVar25;
    ppVar18->first = (int)lVar21;
    iVar32 = (begin._M_current)->second;
    (begin._M_current)->second = ppVar18->second;
    ppVar18->second = iVar32;
    iVar32 = piVar7[(long)pVar26 >> 0x20];
    iVar29 = piVar6[iVar13];
    iVar4 = iVar29;
    if (iVar32 < iVar29) {
      iVar4 = iVar32;
    }
    lVar22 = (long)iVar29 * (long)iVar32;
    ppVar27 = begin._M_current;
    do {
      do {
        begin._M_current = ppVar27 + 1;
        uVar23 = (begin._M_current)->first;
        lVar21 = (long)(int)uVar23;
        uVar1 = ppVar27[1].second;
        iVar32 = piVar7[(int)uVar1];
        iVar29 = piVar6[lVar21];
        iVar20 = iVar29;
        if (iVar32 < iVar29) {
          iVar20 = iVar32;
        }
        ppVar27 = begin._M_current;
      } while ((iVar20 == 2) && (iVar4 != 2));
      ppVar28 = ppVar18;
      if ((iVar4 == 2) && (iVar20 != 2)) break;
      lVar10 = (long)iVar29 * (long)iVar32;
    } while ((lVar10 < lVar22) ||
            ((lVar10 - lVar22 == 0 || lVar10 < lVar22 &&
             ((iVar20 < iVar4 ||
              ((iVar20 <= iVar4 &&
               ((uVar25 = ((ulong)uVar1 + 0x80c8963be3e4c2f3) * ((ulong)uVar23 + 0xc8497d2a400d9551)
                          >> 0x20 ^ ((ulong)uVar1 + 0x8a183895eeac1536) *
                                    ((ulong)uVar23 + 0x42d8680e260ae5b), uVar25 < uVar12 ||
                ((uVar25 <= uVar12 &&
                 (((int)uVar23 < iVar13 || (((int)uVar23 <= iVar13 && ((int)uVar1 < local_a8))))))))
               ))))))));
    do {
      ppVar18 = ppVar28 + -1;
      uVar23 = ppVar28[-1].first;
      uVar25 = (ulong)(int)uVar23;
      uVar1 = ppVar28[-1].second;
      iVar32 = piVar7[(int)uVar1];
      iVar29 = piVar6[uVar25];
      iVar20 = iVar29;
      if (iVar32 < iVar29) {
        iVar20 = iVar32;
      }
      if ((iVar20 == 2) && (iVar4 != 2)) goto LAB_0031da32;
      ppVar28 = ppVar18;
      if ((iVar4 != 2) || (iVar20 == 2)) {
        lVar10 = (long)iVar32 * (long)iVar29;
        if ((lVar10 < lVar22) ||
           ((lVar10 - lVar22 == 0 || lVar10 < lVar22 &&
            ((iVar20 < iVar4 ||
             ((iVar20 <= iVar4 &&
              ((uVar31 = ((ulong)uVar1 + 0x80c8963be3e4c2f3) * ((ulong)uVar23 + 0xc8497d2a400d9551)
                         >> 0x20 ^ ((ulong)uVar23 + 0x42d8680e260ae5b) *
                                   ((ulong)uVar1 + 0x8a183895eeac1536), uVar31 < uVar12 ||
               ((uVar31 <= uVar12 &&
                (((int)uVar23 < iVar13 || (((int)uVar1 < local_a8 && ((int)uVar23 <= iVar13)))))))))
              ))))))) goto LAB_0031da32;
      }
    } while( true );
  }
LAB_0031da3e:
  _Var15._M_current = begin._M_current + -1;
  (a._M_current)->first = begin._M_current[-1].first;
  (a._M_current)->second = begin._M_current[-1].second;
  begin._M_current[-1].first = iVar13;
  begin._M_current[-1].second = local_a8;
  uVar12 = (long)_Var15._M_current - (long)a._M_current >> 3;
  uVar25 = (long)end._M_current - (long)begin._M_current >> 3;
  if (((long)uVar12 < (long)(uVar14 >> 3)) || ((long)uVar25 < (long)(uVar14 >> 3))) {
    local_54 = local_54 + -1;
    if (local_54 == 0) {
      uVar12 = uVar14 - 2 >> 1;
      do {
        std::
        __adjust_heap<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,long,std::pair<int,int>,__gnu_cxx::__ops::_Iter_comp_iter<presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__1>>
                  (a,uVar12,uVar14,a._M_current[uVar12],
                   (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_presolve_HPresolve_cpp:4999:7)>
                    )comp.this);
        bVar9 = uVar12 != 0;
        uVar12 = uVar12 - 1;
      } while (bVar9);
      if (lVar11 < 9) {
        return;
      }
      lVar11 = (long)end._M_current - (long)a._M_current;
      do {
        ppVar24 = end._M_current + -1;
        pVar26 = *ppVar24;
        ppVar24->first = (a._M_current)->first;
        end._M_current[-1].second = (a._M_current)->second;
        lVar11 = lVar11 + -8;
        std::
        __adjust_heap<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,long,std::pair<int,int>,__gnu_cxx::__ops::_Iter_comp_iter<presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__1>>
                  (a,0,lVar11 >> 3,pVar26,
                   (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_presolve_HPresolve_cpp:4999:7)>
                    )comp.this);
        end._M_current = ppVar24;
      } while (8 < lVar11);
      return;
    }
    if (0x17 < (long)uVar12) {
      uVar14 = uVar12 >> 2;
      pVar26 = *a._M_current;
      *a._M_current = a._M_current[uVar14];
      a._M_current[uVar14] = pVar26;
      pVar26 = begin._M_current[-2];
      begin._M_current[-2] = begin._M_current[-1 - uVar14];
      begin._M_current[-1 - uVar14] = pVar26;
      if (0x80 < uVar12) {
        pVar26 = a._M_current[1];
        a._M_current[1] = a._M_current[uVar14 + 1];
        a._M_current[uVar14 + 1] = pVar26;
        pVar26 = a._M_current[2];
        a._M_current[2] = a._M_current[uVar14 + 2];
        a._M_current[uVar14 + 2] = pVar26;
        pVar26 = begin._M_current[-3];
        begin._M_current[-3] = begin._M_current[~uVar14 - 1];
        begin._M_current[~uVar14 - 1] = pVar26;
        pVar26 = begin._M_current[-4];
        begin._M_current[-4] = begin._M_current[-uVar14 + -3];
        begin._M_current[-uVar14 + -3] = pVar26;
      }
    }
    if (0x17 < (long)uVar25) {
      uVar14 = uVar25 >> 2;
      pVar26 = *begin._M_current;
      *begin._M_current = begin._M_current[uVar14];
      begin._M_current[uVar14] = pVar26;
      pVar26 = end._M_current[-1];
      end._M_current[-1] = end._M_current[-uVar14];
      end._M_current[-uVar14] = pVar26;
      if (0x80 < uVar25) {
        pVar26 = begin._M_current[1];
        begin._M_current[1] = begin._M_current[uVar14 + 1];
        begin._M_current[uVar14 + 1] = pVar26;
        pVar26 = begin._M_current[2];
        begin._M_current[2] = begin._M_current[uVar14 + 2];
        begin._M_current[uVar14 + 2] = pVar26;
        pVar26 = end._M_current[-2];
        end._M_current[-2] = end._M_current[~uVar14];
        end._M_current[~uVar14] = pVar26;
        pVar26 = end._M_current[-3];
        end._M_current[-3] = end._M_current[-2 - uVar14];
        end._M_current[-2 - uVar14] = pVar26;
      }
    }
  }
  else if (((_Var16._M_current <= ppVar24) &&
           (bVar9 = partial_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__1>
                              (a,_Var15,comp), bVar9)) &&
          (bVar9 = partial_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__1>
                             (begin,end,comp), bVar9)) {
    return;
  }
  pdqsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__1,false>
            (a,_Var15,comp,local_54,(bool)(leftmost & 1));
  leftmost = false;
  uVar14 = uVar25;
  lVar11 = (long)end._M_current - (long)begin._M_current;
  goto LAB_0031dc5d;
LAB_0031da32:
  if (ppVar18 <= begin._M_current) goto LAB_0031da3e;
  goto LAB_0031d88c;
LAB_0031dc8f:
  if ((leftmost & 1U) == 0) {
LAB_0031dc9a:
    if (begin._M_current == end._M_current) {
      return;
    }
    if (begin._M_current + 1 == end._M_current) {
      return;
    }
    piVar6 = ((comp.this)->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar7 = ((comp.this)->colsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    ppVar24 = begin._M_current + 1;
    do {
      ppVar18 = ppVar24;
      uVar23 = begin._M_current[1].first;
      uVar1 = begin._M_current[1].second;
      uVar2 = (begin._M_current)->first;
      lVar11 = (long)(int)uVar2;
      iVar32 = piVar7[(int)uVar1];
      iVar29 = piVar6[(int)uVar23];
      iVar4 = iVar29;
      if (iVar32 < iVar29) {
        iVar4 = iVar32;
      }
      uVar3 = (begin._M_current)->second;
      iVar13 = piVar7[(int)uVar3];
      iVar20 = piVar6[lVar11];
      iVar5 = iVar20;
      if (iVar13 < iVar20) {
        iVar5 = iVar13;
      }
      if ((iVar4 == 2) && (iVar5 != 2)) {
LAB_0031dd0c:
        pVar26 = *ppVar18;
        iVar32 = pVar26.first;
        uVar14 = (((ulong)pVar26 >> 0x20) + 0x80c8963be3e4c2f3) *
                 (((ulong)pVar26 & 0xffffffff) + 0xc8497d2a400d9551) >> 0x20 ^
                 (((ulong)pVar26 >> 0x20) + 0x8a183895eeac1536) *
                 (((ulong)pVar26 & 0xffffffff) + 0x42d8680e260ae5b);
        do {
          do {
            ppVar24 = begin._M_current;
            ppVar24[1].first = (int)lVar11;
            ppVar24[1].second = ppVar24->second;
            begin._M_current = ppVar24 + -1;
            uVar23 = ppVar24[-1].first;
            lVar11 = (long)(int)uVar23;
            iVar29 = piVar7[(long)pVar26 >> 0x20];
            iVar4 = piVar6[iVar32];
            iVar13 = iVar4;
            if (iVar29 < iVar4) {
              iVar13 = iVar29;
            }
            uVar1 = ppVar24[-1].second;
            iVar20 = piVar7[(int)uVar1];
            iVar5 = piVar6[lVar11];
            iVar8 = iVar5;
            if (iVar20 < iVar5) {
              iVar8 = iVar20;
            }
          } while ((iVar13 == 2) && (iVar8 != 2));
          local_88 = pVar26.second;
          if ((iVar13 != 2) && (iVar8 == 2)) break;
          lVar22 = (long)iVar4 * (long)iVar29;
          lVar10 = (long)iVar5 * (long)iVar20;
        } while ((lVar22 < lVar10) ||
                ((lVar22 - lVar10 == 0 || lVar22 < lVar10 &&
                 ((iVar13 < iVar8 ||
                  ((iVar13 <= iVar8 &&
                   ((uVar12 = ((ulong)uVar1 + 0x80c8963be3e4c2f3) *
                              ((ulong)uVar23 + 0xc8497d2a400d9551) >> 0x20 ^
                              ((ulong)uVar1 + 0x8a183895eeac1536) *
                              ((ulong)uVar23 + 0x42d8680e260ae5b), uVar14 < uVar12 ||
                    ((uVar14 <= uVar12 &&
                     ((iVar32 < (int)uVar23 || ((iVar32 <= (int)uVar23 && (local_88 < (int)uVar1))))
                     ))))))))))));
        ppVar24->first = iVar32;
        ppVar24->second = local_88;
      }
      else if ((iVar4 == 2) || (iVar5 != 2)) {
        lVar22 = (long)iVar29 * (long)iVar32;
        lVar10 = (long)iVar20 * (long)iVar13;
        if (lVar22 < lVar10) goto LAB_0031dd0c;
        if (lVar22 - lVar10 == 0 || lVar22 < lVar10) {
          if (iVar4 < iVar5) goto LAB_0031dd0c;
          if (iVar4 <= iVar5) {
            uVar12 = ((ulong)uVar1 + 0x80c8963be3e4c2f3) * ((ulong)uVar23 + 0xc8497d2a400d9551) >>
                     0x20 ^ ((ulong)uVar1 + 0x8a183895eeac1536) *
                            ((ulong)uVar23 + 0x42d8680e260ae5b);
            uVar14 = ((ulong)uVar3 + 0x80c8963be3e4c2f3) * ((ulong)uVar2 + 0xc8497d2a400d9551) >>
                     0x20 ^ ((ulong)uVar3 + 0x8a183895eeac1536) * ((ulong)uVar2 + 0x42d8680e260ae5b)
            ;
            if ((uVar12 < uVar14) ||
               ((uVar12 <= uVar14 &&
                (((int)uVar23 < (int)uVar2 || ((int)uVar1 < (int)uVar3 && (int)uVar23 <= (int)uVar2)
                 ))))) goto LAB_0031dd0c;
          }
        }
      }
      ppVar24 = ppVar18 + 1;
      begin._M_current = ppVar18;
      if (ppVar18 + 1 == end._M_current) {
        return;
      }
    } while( true );
  }
  goto LAB_0031c992;
}

Assistant:

inline void pdqsort_loop(Iter begin, Iter end, Compare comp, int bad_allowed, bool leftmost = true) {
        typedef typename std::iterator_traits<Iter>::difference_type diff_t;

        // Use a while loop for tail recursion elimination.
        while (true) {
            diff_t size = end - begin;

            // Insertion sort is faster for small arrays.
            if (size < insertion_sort_threshold) {
                if (leftmost) insertion_sort(begin, end, comp);
                else unguarded_insertion_sort(begin, end, comp);
                return;
            }

            // Choose pivot as median of 3 or pseudomedian of 9.
            diff_t s2 = size / 2;
            if (size > ninther_threshold) {
                sort3(begin, begin + s2, end - 1, comp);
                sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
                sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
                sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
                std::iter_swap(begin, begin + s2);
            } else sort3(begin + s2, begin, end - 1, comp);

            // If *(begin - 1) is the end of the right partition of a previous partition operation
            // there is no element in [begin, end) that is smaller than *(begin - 1). Then if our
            // pivot compares equal to *(begin - 1) we change strategy, putting equal elements in
            // the left partition, greater elements in the right partition. We do not have to
            // recurse on the left partition, since it's sorted (all equal).
            if (!leftmost && !comp(*(begin - 1), *begin)) {
                begin = partition_left(begin, end, comp) + 1;
                continue;
            }

            // Partition and get results.
            std::pair<Iter, bool> part_result =
                Branchless ? partition_right_branchless(begin, end, comp)
                           : partition_right(begin, end, comp);
            Iter pivot_pos = part_result.first;
            bool already_partitioned = part_result.second;

            // Check for a highly unbalanced partition.
            diff_t l_size = pivot_pos - begin;
            diff_t r_size = end - (pivot_pos + 1);
            bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

            // If we got a highly unbalanced partition we shuffle elements to break many patterns.
            if (highly_unbalanced) {
                // If we had too many bad partitions, switch to heapsort to guarantee O(n log n).
                if (--bad_allowed == 0) {
                    std::make_heap(begin, end, comp);
                    std::sort_heap(begin, end, comp);
                    return;
                }

                if (l_size >= insertion_sort_threshold) {
                    std::iter_swap(begin,             begin + l_size / 4);
                    std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);

                    if (l_size > ninther_threshold) {
                        std::iter_swap(begin + 1,         begin + (l_size / 4 + 1));
                        std::iter_swap(begin + 2,         begin + (l_size / 4 + 2));
                        std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
                        std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
                    }
                }
                
                if (r_size >= insertion_sort_threshold) {
                    std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
                    std::iter_swap(end - 1,                   end - r_size / 4);
                    
                    if (r_size > ninther_threshold) {
                        std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
                        std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
                        std::iter_swap(end - 2,             end - (1 + r_size / 4));
                        std::iter_swap(end - 3,             end - (2 + r_size / 4));
                    }
                }
            } else {
                // If we were decently balanced and we tried to sort an already partitioned
                // sequence try to use insertion sort.
                if (already_partitioned && partial_insertion_sort(begin, pivot_pos, comp)
                                        && partial_insertion_sort(pivot_pos + 1, end, comp)) return;
            }
                
            // Sort the left partition first using recursion and do tail recursion elimination for
            // the right-hand partition.
            pdqsort_loop<Iter, Compare, Branchless>(begin, pivot_pos, comp, bad_allowed, leftmost);
            begin = pivot_pos + 1;
            leftmost = false;
        }
    }